

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall glu::Program::~Program(Program *this)

{
  Program *this_local;
  
  (**(code **)(this->m_gl + 0x448))(this->m_program);
  ProgramInfo::~ProgramInfo(&this->m_info);
  return;
}

Assistant:

Program::~Program (void)
{
	m_gl.deleteProgram(m_program);
}